

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86XOR(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,int num)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  if (1 < size - sDWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x7d9,"int x86XOR(unsigned char *, x86Size, x86Reg, int, x86Reg, int, int)");
  }
  bVar1 = 8 < (int)base | (8 < (int)index) * '\x02' | (size == sQWORD) << 3;
  if (bVar1 != 0) {
    *stream = bVar1 | 0x40;
  }
  uVar3 = (ulong)(bVar1 != 0);
  stream[uVar3] = 0x81;
  uVar2 = encodeAddress(stream + uVar3 + 1,index,multiplier,base,shift,6);
  *(int *)(stream + uVar2 + uVar3 + 1) = num;
  return ((int)(stream + uVar2 + uVar3 + 1) - (int)stream) + 4;
}

Assistant:

int x86XOR(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, int num)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, rNONE, index, base);
	*stream++ = 0x81;
	stream += encodeAddress(stream, index, multiplier, base, shift, 6);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}